

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test::
TestBody(AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
         *this)

{
  ByteData *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  _func_int *p_Var5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  ByteData bytedata;
  Transaction tx;
  ByteData bytedata2;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  char local_208 [16];
  internal local_1f8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  AbstractTxInReference local_1e8;
  string local_158;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_138;
  Transaction local_120;
  ByteData local_e0;
  ScriptWitness local_c8;
  ScriptWitness local_a8;
  ScriptWitness local_88;
  ScriptWitness local_68;
  ScriptWitness local_48;
  
  cfd::core::Transaction::Transaction(&local_120,2,3);
  local_218._0_8_ = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             "");
  cfd::core::Txid::Txid((Txid *)local_238,(string *)local_218);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac","");
  cfd::core::Script::Script((Script *)&local_1e8,&local_158);
  cfd::core::Transaction::AddTxIn(&local_120,(Txid *)local_238,0,0xffffffff,(Script *)&local_1e8);
  cfd::core::Script::~Script((Script *)&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  local_238._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_238._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_238._8_8_);
  }
  if ((char *)local_218._0_8_ != local_208) {
    operator_delete((void *)local_218._0_8_);
  }
  cfd::core::ByteData::ByteData((ByteData *)&local_158);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Transaction::AddScriptWitnessStack(&local_48,&local_120,3,(ByteData *)&local_158);
    local_48._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              (&local_48.witness_stack_);
  }
  testing::Message::Message((Message *)&local_1e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_238,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xc9,
             "Expected: tx.AddScriptWitnessStack(3, bytedata) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
  if (local_1e8._vptr_AbstractTxInReference != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_1e8._vptr_AbstractTxInReference != (_func_int **)0x0)) {
      (**(code **)(*local_1e8._vptr_AbstractTxInReference + 8))();
    }
  }
  pBVar1 = &local_1e8.txid_.data_;
  local_1e8._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763","");
  cfd::core::ByteData::ByteData(&local_e0,(string *)&local_1e8);
  if ((ByteData *)local_1e8._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(local_1e8._vptr_AbstractTxInReference);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::AddScriptWitnessStack(&local_68,&local_120,0,&local_e0);
      local_68._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_68.witness_stack_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xcd,
               "Expected: tx.AddScriptWitnessStack(0, bytedata2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
    if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_1e8._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_1e8,&local_120,0);
  local_218._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_218 + 8),
             &local_1e8.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness(&local_138,(ScriptWitness *)local_218);
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)local_238,
             local_138.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
             ._M_impl.super__Vector_impl_data._M_start);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()",
             "\"02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\"",
             (char *)local_238._0_8_,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  if ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_138);
  local_218._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_218 + 8));
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_1e8);
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    if (local_1f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
    if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_1e8._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Transaction::SetScriptWitnessStack(&local_88,&local_120,3,0,(ByteData *)&local_158);
    local_88._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              (&local_88.witness_stack_);
  }
  testing::Message::Message((Message *)&local_1e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_238,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xd3,
             "Expected: tx.SetScriptWitnessStack(3, 0, bytedata) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
  if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
      (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    local_1e8._vptr_AbstractTxInReference)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Transaction::SetScriptWitnessStack(&local_a8,&local_120,3,3,(ByteData *)&local_158);
    local_a8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              (&local_a8.witness_stack_);
  }
  testing::Message::Message((Message *)&local_1e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_238,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xd4,
             "Expected: tx.SetScriptWitnessStack(3, 3, bytedata) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
  if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
      (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    local_1e8._vptr_AbstractTxInReference)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1e8._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"82780763","");
      cfd::core::ByteData::ByteData((ByteData *)local_238,(string *)&local_1e8);
      cfd::core::Transaction::SetScriptWitnessStack(&local_c8,&local_120,0,0,(ByteData *)local_238);
      local_c8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_c8.witness_stack_);
      if ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_238._0_8_);
      }
      if ((ByteData *)local_1e8._vptr_AbstractTxInReference != pBVar1) {
        operator_delete(local_1e8._vptr_AbstractTxInReference);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd5,
               "Expected: tx.SetScriptWitnessStack(0, 0, ByteData(\"82780763\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
    if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_1e8._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_1e8,&local_120,0);
  local_218._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_218 + 8),
             &local_1e8.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness(&local_138,(ScriptWitness *)local_218);
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)local_238,
             local_138.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
             ._M_impl.super__Vector_impl_data._M_start);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()",
             "\"82780763\"",(char *)local_238._0_8_,"82780763");
  if ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_138);
  local_218._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_218 + 8));
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_1e8);
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    if (local_1f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
    if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_1e8._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = cfd::core::Transaction::GetScriptWitnessStackNum(&local_120,0);
  local_238._0_4_ = uVar3;
  local_218._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1e8,"tx.GetScriptWitnessStackNum(0)","1",(uint *)local_238,
             (int *)local_218);
  if ((char)local_1e8._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_238);
    if (local_1e8.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var5 = (_func_int *)0x5a7ade;
    }
    else {
      p_Var5 = *local_1e8.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd9,(char *)p_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_238._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Transaction::RemoveScriptWitnessStackAll(&local_120,3);
  }
  testing::Message::Message((Message *)&local_1e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_238,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xdc,
             "Expected: tx.RemoveScriptWitnessStackAll(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
  if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
      (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    local_1e8._vptr_AbstractTxInReference)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll(&local_120,0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xdd,
               "Expected: tx.RemoveScriptWitnessStackAll(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
    if ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((ByteData *)local_1e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_1e8._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  uVar3 = cfd::core::Transaction::GetScriptWitnessStackNum(&local_120,0);
  local_238._0_4_ = uVar3;
  local_218._0_8_ = local_218._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1e8,"tx.GetScriptWitnessStackNum(0)","0",(uint *)local_238,
             (int *)local_218);
  if ((char)local_1e8._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_238);
    if (local_1e8.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var5 = (_func_int *)0x5a7ade;
    }
    else {
      p_Var5 = *local_1e8.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xde,(char *)p_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_238._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  cfd::core::Transaction::~Transaction(&local_120);
  return;
}

Assistant:

TEST(AbstractTransaction, AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  ByteData bytedata;
  // AddScriptWitnessStack
  EXPECT_THROW(tx.AddScriptWitnessStack(3, bytedata), CfdException);

  ByteData bytedata2(
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, bytedata2));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");

  // SetScriptWitnessStack
  EXPECT_THROW(tx.SetScriptWitnessStack(3, 0, bytedata), CfdException);
  EXPECT_THROW(tx.SetScriptWitnessStack(3, 3, bytedata), CfdException);
  EXPECT_NO_THROW(tx.SetScriptWitnessStack(0, 0, ByteData("82780763")));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "82780763");
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 1);

  // RemoveScriptWitnessStackAll
  EXPECT_THROW(tx.RemoveScriptWitnessStackAll(3), CfdException);
  EXPECT_NO_THROW(tx.RemoveScriptWitnessStackAll(0));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
}